

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O1

void __thiscall
MockNamedValueComparatorsAndCopiersRepository::installComparatorsAndCopiers
          (MockNamedValueComparatorsAndCopiersRepository *this,
          MockNamedValueComparatorsAndCopiersRepository *repository)

{
  MockNamedValueComparatorsAndCopiersRepositoryNode *other;
  MockNamedValueComparator *pMVar1;
  MockNamedValueCopier *pMVar2;
  MockNamedValueComparatorsAndCopiersRepositoryNode *pMVar3;
  MockNamedValueComparatorsAndCopiersRepositoryNode *this_00;
  
  for (other = repository->head_; other != (MockNamedValueComparatorsAndCopiersRepositoryNode *)0x0;
      other = other->next_) {
    this_00 = (MockNamedValueComparatorsAndCopiersRepositoryNode *)
              operator_new(0x28,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
                           ,0x295);
    pMVar1 = other->comparator_;
    pMVar2 = other->copier_;
    pMVar3 = this->head_;
    SimpleString::SimpleString((SimpleString *)this_00,&other->name_);
    this_00->comparator_ = pMVar1;
    this_00->copier_ = pMVar2;
    this_00->next_ = pMVar3;
    this->head_ = this_00;
  }
  return;
}

Assistant:

void MockNamedValueComparatorsAndCopiersRepository::installComparatorsAndCopiers(const MockNamedValueComparatorsAndCopiersRepository& repository)
{
    for (MockNamedValueComparatorsAndCopiersRepositoryNode* p = repository.head_; p; p = p->next_)
      head_ = new MockNamedValueComparatorsAndCopiersRepositoryNode(p->name_, p->comparator_, p->copier_, head_);
}